

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

void __thiscall
bloaty::ReadDWARFDebugInfo
          (bloaty *this,InfoReader *reader,Section section,DualMap *symbol_map,RangeSink *sink)

{
  uint16_t uVar1;
  pointer pAVar2;
  AttrValue val;
  AttrValue val_00;
  string_view file_range;
  bool bVar3;
  Abbrev *pAVar4;
  undefined4 in_register_00000014;
  pointer pAVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  CompilationUnitSizes sizes;
  string_view data_with_length;
  DIEReader die_reader;
  DwoFilePointer dwo_info;
  File dwo_dwarf;
  CU cu;
  CUIter iter;
  GeneralDIE compileunit_die;
  string_view local_388;
  File *local_378;
  Abbrev *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  DIEReader local_340;
  undefined **local_328;
  InfoReader *local_320;
  RangeSink *local_318;
  undefined1 local_310 [8];
  undefined1 local_308 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  File local_2c8;
  CU local_1d8;
  _Any_data local_120;
  code *local_110;
  code *local_108;
  CUIter local_100;
  GeneralDIE local_e8;
  
  local_378 = (File *)CONCAT44(in_register_00000014,section);
  local_320 = (InfoReader *)this;
  dwarf::InfoReader::GetCUIter(&local_100,(InfoReader *)this,(Section)reader,0);
  local_1d8.unit_name_._M_dataplus._M_p = (pointer)&local_1d8.unit_name_.field_2;
  local_1d8.data_._M_len = 0;
  local_1d8.data_._M_str = (char *)0x0;
  local_1d8.entire_unit_._M_len = 0;
  local_1d8.entire_unit_._M_str = (char *)0x0;
  local_1d8.unit_name_._M_string_length = 0;
  local_1d8.unit_name_.field_2._M_local_buf[0] = '\0';
  local_1d8.addr_base_ = 0;
  local_1d8.str_offsets_base_ = 0;
  local_1d8.range_lists_base_ = 0;
  local_1d8.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1d8.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
  local_1d8.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1d8.strp_callback_._M_invoker = (_Invoker_type)0x0;
  local_120._8_8_ = &local_1d8;
  local_108 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf.cc:591:32)>
              ::_M_invoke;
  local_110 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf.cc:591:32)>
              ::_M_manager;
  local_120._M_unused._M_object = symbol_map;
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator=
            (&local_1d8.strp_callback_,
             (function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&local_120);
  std::_Function_base::~_Function_base((_Function_base *)&local_120);
  local_328 = &PTR__InputFileFactory_005bb250;
  local_318 = (RangeSink *)symbol_map;
  do {
    bVar3 = dwarf::CUIter::NextCU(&local_100,local_320,&local_1d8);
    if (!bVar3) {
      dwarf::CU::~CU(&local_1d8);
      return;
    }
    local_340.remaining_._M_len = local_1d8.data_._M_len;
    local_340.remaining_._M_str = local_1d8.data_._M_str;
    local_340.depth_ = 0;
    local_e8.name.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = false;
    local_e8.location_string.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = false;
    local_e8.location_uint64.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.low_pc.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.high_pc_addr.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.high_pc_size.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.rnglistx.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.ranges.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = 0;
    local_e8.start_scope.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.declaration = false;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    pAVar4 = dwarf::DIEReader::ReadCode(&local_340,&local_1d8);
    local_370 = (Abbrev *)
                (pAVar4->attr).
                super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar4 = (Abbrev *)
                  (pAVar4->attr).
                  super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar4 != local_370;
        pAVar4 = (Abbrev *)&pAVar4->tag) {
      uVar1 = (uint16_t)pAVar4->code;
      dwarf::AttrValue::ParseAttr
                ((AttrValue *)&local_368,(AttrValue *)&local_1d8,
                 (CU *)(ulong)*(uint16_t *)((long)&pAVar4->code + 2),(uint16_t)&local_340,
                 (string_view *)sink);
      local_2c8.debug_addr._M_len = local_368.field_2._M_allocated_capacity;
      local_2c8.debug_abbrev._M_str = (char *)local_368._M_string_length;
      local_2c8.debug_abbrev._M_len = (size_t)local_368._M_dataplus._M_p;
      val.field_0.string_._M_str = (char *)local_368._M_string_length;
      val.field_0.uint_ = (uint64_t)local_368._M_dataplus._M_p;
      val.form_ = local_368.field_2._M_allocated_capacity._0_2_;
      val._18_2_ = local_368.field_2._M_allocated_capacity._2_2_;
      val.type_ = local_368.field_2._M_allocated_capacity._4_4_;
      ReadGeneralDIEAttr(uVar1,val,&local_1d8,&local_e8);
      if (uVar1 == 0x2130) {
        if ((local_2c8.debug_addr._M_len._4_4_ & 0xfffffffd) == 1) {
          local_388 = dwarf::AttrValue::GetString((AttrValue *)&local_2c8,&local_1d8);
          std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&local_2e8,&local_388);
        }
      }
      else if ((uVar1 == 0x1b) && ((local_2c8.debug_addr._M_len._4_4_ & 0xfffffffd) == 1)) {
        local_388 = dwarf::AttrValue::GetString((AttrValue *)&local_2c8,&local_1d8);
        std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)local_308,&local_388);
      }
    }
    if ((local_308._8_8_ != 0) && (local_2e8._M_string_length != 0)) {
      local_310 = (undefined1  [8])local_328;
      std::operator+(&local_368,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     "/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8
                     ,&local_368,&local_2e8);
      MmapInputFileFactory::OpenFile((MmapInputFileFactory *)&local_388,(string *)local_310);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_368);
      memset(&local_2c8,0,0xe0);
      (*(local_1d8.dwarf_)->open)((InputFile *)local_388._M_len,&local_2c8,(RangeSink *)symbol_map);
      ReadDWARFCompileUnits
                ((bloaty *)&local_2c8,local_378,(DualMap *)&local_1d8,(CU *)symbol_map,sink);
      if ((long *)local_388._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_388._M_len + 0x10))();
      }
    }
    if (local_1d8.unit_name_._M_string_length != 0) {
      file_range._M_str = local_1d8.entire_unit_._M_str;
      file_range._M_len = local_1d8.entire_unit_._M_len;
      name._M_str = local_1d8.unit_name_._M_dataplus._M_p;
      name._M_len = local_1d8.unit_name_._M_string_length;
      RangeSink::AddFileRange((RangeSink *)symbol_map,"dwarf_debuginfo",name,file_range);
      AddDIE(&local_1d8,&local_e8,(DualMap *)local_378,(RangeSink *)symbol_map);
      if (local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        local_2c8.debug_abbrev._M_len = ((local_1d8.dwarf_)->debug_line)._M_len;
        local_2c8.debug_abbrev._M_str = ((local_1d8.dwarf_)->debug_line)._M_str;
        ReadBytes(local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload._M_value,
                  &local_2c8.debug_abbrev);
        local_368._M_dataplus._M_p = (pointer)local_2c8.debug_abbrev._M_len;
        local_368._M_string_length = (size_type)local_2c8.debug_abbrev._M_str;
        local_2c8.debug_abbrev =
             dwarf::CompilationUnitSizes::ReadInitialLength
                       ((CompilationUnitSizes *)&local_388,&local_2c8.debug_abbrev);
        local_2c8.debug_abbrev =
             std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_368,0,
                        (size_type)
                        (local_2c8.debug_abbrev._M_str +
                        (local_2c8.debug_abbrev._M_len - local_368._M_string_length)));
        name_00._M_str = local_1d8.unit_name_._M_dataplus._M_p;
        name_00._M_len = local_1d8.unit_name_._M_string_length;
        RangeSink::AddFileRange
                  ((RangeSink *)symbol_map,"dwarf_stmtlistrange",name_00,local_2c8.debug_abbrev);
      }
      sink = (RangeSink *)((local_1d8.unit_abbrev_)->abbrev_data_)._M_len;
      name_01._M_str = local_1d8.unit_name_._M_dataplus._M_p;
      name_01._M_len = local_1d8.unit_name_._M_string_length;
      RangeSink::AddFileRange
                ((RangeSink *)symbol_map,"dwarf_abbrev",name_01,
                 (local_1d8.unit_abbrev_)->abbrev_data_);
      while( true ) {
        pAVar4 = dwarf::DIEReader::ReadCode(&local_340,&local_1d8);
        if (pAVar4 == (Abbrev *)0x0) break;
        local_2c8.debug_addr._M_len = local_2c8.debug_addr._M_len & 0xffffffffffffff00;
        local_2c8.debug_aranges._M_str._0_1_ = 0;
        local_2c8.debug_info._M_str._0_1_ = 0;
        local_2c8.debug_line._M_str._0_1_ = '\0';
        local_2c8.debug_loc._M_str._0_1_ = 0;
        local_2c8.debug_pubnames._M_str._0_1_ = 0;
        local_2c8.debug_pubtypes._M_str._0_1_ = 0;
        local_2c8.debug_ranges._M_str._0_1_ = 0;
        local_2c8.debug_rnglists._M_str._0_1_ = 0;
        local_2c8.debug_str._M_str._0_1_ = 0;
        local_2c8.debug_str_offsets._M_len._0_1_ = '\0';
        pAVar2 = (pAVar4->attr).
                 super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_370 = pAVar4;
        for (pAVar5 = (pAVar4->attr).
                      super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                      ._M_impl.super__Vector_impl_data._M_start; symbol_map = (DualMap *)local_318,
            pAVar4 = local_370, pAVar5 != pAVar2; pAVar5 = pAVar5 + 1) {
          uVar1 = pAVar5->name;
          dwarf::AttrValue::ParseAttr
                    ((AttrValue *)&local_368,(AttrValue *)&local_1d8,(CU *)(ulong)pAVar5->form,
                     (uint16_t)&local_340,(string_view *)sink);
          val_00.field_0.string_._M_str = (char *)local_368._M_string_length;
          val_00.field_0.uint_ = (uint64_t)local_368._M_dataplus._M_p;
          val_00.form_ = local_368.field_2._M_allocated_capacity._0_2_;
          val_00._18_2_ = local_368.field_2._M_allocated_capacity._2_2_;
          val_00.type_ = local_368.field_2._M_allocated_capacity._4_4_;
          ReadGeneralDIEAttr(uVar1,val_00,&local_1d8,(GeneralDIE *)&local_2c8);
        }
        if ((char)local_2c8.debug_line._M_str == '\x01') {
          bVar3 = dwarf::CU::IsValidDwarfAddress(&local_1d8,local_2c8.debug_line._M_len);
          if (bVar3) goto LAB_00193bee;
LAB_00193bf8:
          dwarf::DIEReader::SkipChildren(&local_340,&local_1d8,pAVar4);
        }
        else {
LAB_00193bee:
          if ((char)local_2c8.debug_str_offsets._M_len == '\x01') goto LAB_00193bf8;
          AddDIE(&local_1d8,(GeneralDIE *)&local_2c8,(DualMap *)local_378,(RangeSink *)symbol_map);
        }
      }
    }
    DwoFilePointer::~DwoFilePointer((DwoFilePointer *)local_308);
  } while( true );
}

Assistant:

static void ReadDWARFDebugInfo(dwarf::InfoReader& reader,
                               dwarf::InfoReader::Section section,
                               const DualMap& symbol_map, RangeSink* sink) {
  dwarf::CUIter iter = reader.GetCUIter(section);
  dwarf::CU cu;
  cu.SetIndirectStringCallback([sink, &cu](string_view str) {
    sink->AddFileRange("dwarf_strp", cu.unit_name(), str);
  });

  while (iter.NextCU(reader, &cu)) {
    dwarf::DIEReader die_reader = cu.GetDIEReader();
    GeneralDIE compileunit_die;
    DwoFilePointer dwo_info;
    auto* abbrev = die_reader.ReadCode(cu);
    die_reader.ReadAttributes(
        cu, abbrev,
        [&](uint16_t tag, dwarf::AttrValue value) {
          ReadGeneralDIEAttr(tag, value, cu, &compileunit_die);
          switch (tag) {
            case DW_AT_comp_dir:
              if (value.IsString()) {
                dwo_info.comp_dir = value.GetString(cu);
              }
              break;
            case DW_AT_GNU_dwo_name:
              if (value.IsString()) {
                dwo_info.dwo_name = value.GetString(cu);
              }
              break;
          }
        });

    if (!dwo_info.comp_dir.empty() && !dwo_info.dwo_name.empty()) {
      auto file = MmapInputFileFactory().OpenFile(dwo_info.comp_dir + "/" + dwo_info.dwo_name);
      dwarf::File dwo_dwarf;
      cu.dwarf().open(*file, &dwo_dwarf, sink);
      ReadDWARFCompileUnits(dwo_dwarf, symbol_map, &cu, sink);
    }

    if (cu.unit_name().empty()) {
      continue;
    }

    sink->AddFileRange("dwarf_debuginfo", cu.unit_name(), cu.entire_unit());
    AddDIE(cu, compileunit_die, symbol_map, sink);

    if (compileunit_die.stmt_list) {
      ReadDWARFStmtListRange(cu, *compileunit_die.stmt_list, sink);
    }

    sink->AddFileRange("dwarf_abbrev", cu.unit_name(), cu.unit_abbrev().abbrev_data());

    while (auto abbrev = die_reader.ReadCode(cu)) {
      GeneralDIE die;
      die_reader.ReadAttributes(
          cu, abbrev, [&cu, &die](uint16_t tag, dwarf::AttrValue value) {
            ReadGeneralDIEAttr(tag, value, cu, &die);
          });

      // low_pc == 0 is a signal that this routine was stripped out of the
      // final binary. Also any declaration should be skipped.
      if ((die.low_pc && !cu.IsValidDwarfAddress(*die.low_pc)) ||
          die.declaration) {
        die_reader.SkipChildren(cu, abbrev);
      } else {
        AddDIE(cu, die, symbol_map, sink);
      }
    }
  }
}